

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O3

void * deqp::egl::Image::checkCallError<void*>
                 (EglTestContext *eglTestCtx,char *call,void *returnValue,EGLint expectError)

{
  TestContext *this;
  TestLog *pTVar1;
  size_t sVar2;
  Library *pLVar3;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  this = eglTestCtx->m_testCtx;
  pTVar1 = this->m_log;
  local_1b0 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (call == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
  }
  else {
    sVar2 = strlen(call);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,call,sVar2);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pLVar3 = EglTestContext::getLibrary(eglTestCtx);
  local_1d0.m_value = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
  if (local_1d0.m_value != expectError) {
    local_1b0 = (undefined1  [8])pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"  Fail: Error code mismatch! Expected ",0x26);
    local_1c0.m_getName = eglu::getErrorName;
    local_1c0.m_value = expectError;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", got ",6);
    local_1d0.m_getName = eglu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)&local_1a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    local_1b0 = (undefined1  [8])pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"  ",2);
    std::ostream::_M_insert<void_const*>((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," was returned",0xd);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    if (this->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this,QP_TEST_RESULT_FAIL,"Invalid error code");
    }
  }
  return returnValue;
}

Assistant:

RetVal checkCallError (EglTestContext& eglTestCtx, const char* call, RetVal returnValue, EGLint expectError)
{
	tcu::TestContext&	testCtx		= eglTestCtx.getTestContext();
	TestLog&			log			= testCtx.getLog();
	EGLint				error;

	log << TestLog::Message << call << TestLog::EndMessage;

	error = eglTestCtx.getLibrary().getError();

	if (error != expectError)
	{
		log << TestLog::Message << "  Fail: Error code mismatch! Expected " << eglu::getErrorStr(expectError) << ", got " << eglu::getErrorStr(error) << TestLog::EndMessage;
		log << TestLog::Message << "  " << returnValue << " was returned" << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error code");
	}

	return returnValue;
}